

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ConditionalStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConditionalStatementSyntax,slang::syntax::ConditionalStatementSyntax_const&>
          (BumpAllocator *this,ConditionalStatementSyntax *args)

{
  ConditionalStatementSyntax *this_00;
  
  this_00 = (ConditionalStatementSyntax *)allocate(this,0xb0,8);
  slang::syntax::ConditionalStatementSyntax::ConditionalStatementSyntax(this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }